

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.pb.cc
# Opt level: O3

char * __thiscall google::protobuf::Mixin::_InternalParse(Mixin *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  ArenaStringPtr *this_01;
  byte bVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  Arena *pAVar6;
  UnknownFieldSet *unknown;
  byte *pbVar7;
  internal *this_02;
  ArenaStringPtr *this_03;
  uint res;
  string *psVar8;
  StringPiece str;
  pair<const_char_*,_unsigned_int> pVar9;
  byte *local_38;
  char *ptr_local;
  ArenaStringPtr *field_name;
  char *size;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  this_01 = &this->root_;
  this_03 = &this->name_;
  local_38 = (byte *)ptr;
  do {
    bVar2 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar2) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    res = (uint)bVar1;
    pbVar7 = local_38 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*pbVar7 * 0x80) - 0x80;
      if ((char)*pbVar7 < '\0') {
        pVar9 = internal::ReadTagFallback((char *)local_38,res);
        pbVar7 = (byte *)pVar9.first;
        if (pbVar7 == (byte *)0x0) {
          return (char *)0x0;
        }
        res = pVar9.second;
      }
      else {
        pbVar7 = local_38 + 2;
      }
    }
    uVar4 = res >> 3;
    field_name = (ArenaStringPtr *)(ulong)uVar4;
    local_38 = pbVar7;
    if (uVar4 == 2) {
      if ((char)res == '\x12') {
        pAVar6 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
        }
        psVar8 = this_01->ptr_;
        field_name = this_01;
        if (psVar8 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_01,pAVar6,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          psVar8 = this_01->ptr_;
        }
        local_38 = (byte *)internal::InlineGreedyStringParser(psVar8,(char *)local_38,ctx);
        this_02 = (internal *)(psVar8->_M_dataplus)._M_p;
        size = (char *)psVar8->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        }
        pcVar5 = "google.protobuf.Mixin.root";
        goto LAB_00209808;
      }
LAB_0020982a:
      if ((res == 0) || ((res & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        return (char *)pbVar7;
      }
      if (((ulong)this_00->ptr_ & 1) == 0) {
        unknown = internal::InternalMetadata::
                  mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
      }
      else {
        unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
      }
      local_38 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_38,ctx);
      cVar3 = '\x02';
      if (local_38 == (byte *)0x0) {
        return (char *)0x0;
      }
    }
    else {
      if ((uVar4 != 1) || ((char)res != '\n')) goto LAB_0020982a;
      pAVar6 = (Arena *)this_00->ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
      }
      psVar8 = this_03->ptr_;
      if (psVar8 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (this_03,pAVar6,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar8 = this_03->ptr_;
      }
      local_38 = (byte *)internal::InlineGreedyStringParser(psVar8,(char *)local_38,ctx);
      this_02 = (internal *)(psVar8->_M_dataplus)._M_p;
      size = (char *)psVar8->_M_string_length;
      if ((long)size < 0) {
        StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
      }
      pcVar5 = "google.protobuf.Mixin.name";
LAB_00209808:
      str.length_ = (stringpiece_ssize_type)pcVar5;
      str.ptr_ = size;
      bVar2 = internal::VerifyUTF8(this_02,str,(char *)field_name);
      if (!bVar2) {
        return (char *)0x0;
      }
      cVar3 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
    }
    if (cVar3 != '\x02') {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Mixin::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Mixin.name"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // string root = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          auto str = _internal_mutable_root();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Mixin.root"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}